

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall
CLI::App::_find_subcommand(App *this,string *subc_name,bool ignore_disabled,bool ignore_used)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  const_iterator this_00;
  const_iterator __str;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  App *pAVar5;
  element_type *peVar6;
  byte in_CL;
  byte bVar7;
  byte in_DL;
  App *in_RSI;
  long in_RDI;
  App *subc;
  App_p *com;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  string *in_stack_00000190;
  App *in_stack_00000198;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  byte in_stack_ffffffffffffff8f;
  element_type *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffe0;
  
  bVar7 = in_DL & 1;
  bVar1 = in_CL & 1;
  lVar3 = in_RDI + 0x2c0;
  this_00 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
            begin((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                  CONCAT17(in_stack_ffffffffffffff8f,
                           CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  __str = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                    ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff8f,
                                 CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  do {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff8f,
                                   CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (App *)0x0;
    }
    this_01 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
               ::operator*((__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                            *)&stack0xffffffffffffffd0)->
               super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1ba570);
    if (((peVar4->disabled_ & 1U) == 0) || ((bVar7 & 1) == 0)) {
      peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )0x1ba58c);
      get_name_abi_cxx11_(peVar4);
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1ba59c);
      if (bVar2) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1ba5ac);
        pAVar5 = _find_subcommand(in_RSI,(string *)
                                         CONCAT17(bVar7,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
                                  SUB81((ulong)lVar3 >> 0x38,0),SUB81((ulong)lVar3 >> 0x30,0));
        if (pAVar5 != (App *)0x0) {
          return pAVar5;
        }
      }
      in_stack_ffffffffffffff90 =
           std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ba5f4);
      ::std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 this_00._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __str._M_current);
      in_stack_ffffffffffffff8f = check_name(in_stack_00000198,in_stack_00000190);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff90);
      if ((in_stack_ffffffffffffff8f & 1) != 0) {
        peVar4 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff8e = operator_cast_to_bool(peVar4);
        if ((!(bool)in_stack_ffffffffffffff8e) || ((bVar1 & 1) == 0)) {
          peVar6 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
          return peVar6;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  *)&stack0xffffffffffffffd0);
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE App *
App::_find_subcommand(const std::string &subc_name, bool ignore_disabled, bool ignore_used) const noexcept {
    for(const App_p &com : subcommands_) {
        if(com->disabled_ && ignore_disabled)
            continue;
        if(com->get_name().empty()) {
            auto *subc = com->_find_subcommand(subc_name, ignore_disabled, ignore_used);
            if(subc != nullptr) {
                return subc;
            }
        }
        if(com->check_name(subc_name)) {
            if((!*com) || !ignore_used)
                return com.get();
        }
    }
    return nullptr;
}